

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::FBXImporter::CanRead(FBXImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  __type _Var1;
  long lVar2;
  char *local_98;
  char *tokens [1];
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string *local_38;
  string *extension;
  IOSystem *pIStack_28;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  FBXImporter *this_local;
  
  extension._7_1_ = checkSig;
  pIStack_28 = pIOHandler;
  pIOHandler_local = (IOSystem *)pFile;
  pFile_local = (string *)this;
  BaseImporter::GetExtension(&local_58,pFile);
  local_38 = &local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,(char *)0x2b95c0,&local_79);
  _Var1 = std::operator==(&local_58,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  if (_Var1) {
    this_local._7_1_ = true;
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if (((lVar2 == 0) || ((extension._7_1_ & 1) != 0)) && (pIStack_28 != (IOSystem *)0x0)) {
      local_98 = "fbx";
      this_local._7_1_ =
           BaseImporter::SearchFileHeaderForToken
                     (pIStack_28,(string *)pIOHandler_local,&local_98,1,200,false,false);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  tokens[0]._0_4_ = 1;
  std::__cxx11::string::~string((string *)&local_58);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool FBXImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == std::string( desc.mFileExtensions ) ) {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        // at least ASCII-FBX files usually have a 'FBX' somewhere in their head
        const char* tokens[] = {"fbx"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}